

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall aiAnimMesh::aiAnimMesh(aiAnimMesh *this)

{
  uint local_18;
  uint local_14;
  uint a_1;
  uint a;
  aiAnimMesh *this_local;
  
  aiString::aiString(&this->mName);
  this->mVertices = (aiVector3D *)0x0;
  this->mNormals = (aiVector3D *)0x0;
  this->mTangents = (aiVector3D *)0x0;
  this->mBitangents = (aiVector3D *)0x0;
  memset(this->mColors,0,0x40);
  memset(this->mTextureCoords,0,0x40);
  this->mNumVertices = 0;
  this->mWeight = 0.0;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    this->mTextureCoords[local_14] = (aiVector3D *)0x0;
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    this->mColors[local_18] = (aiColor4D *)0x0;
  }
  return;
}

Assistant:

aiAnimMesh() AI_NO_EXCEPT
        : mVertices( nullptr )
        , mNormals(nullptr)
        , mTangents(nullptr)
        , mBitangents(nullptr)
        , mColors()
        , mTextureCoords()
        , mNumVertices( 0 )
        , mWeight( 0.0f )
    {
        // fixme consider moving this to the ctor initializer list as well
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++){
            mTextureCoords[a] = nullptr;
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            mColors[a] = nullptr;
        }
    }